

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O0

void __thiscall
btSoftBody::appendLink(btSoftBody *this,Node *node0,Node *node1,Material *mat,bool bcheckexist)

{
  bool bVar1;
  int iVar2;
  Link *pLVar3;
  Node *in_RCX;
  btSoftBody *in_RDX;
  Node *in_RSI;
  btVector3 *in_RDI;
  btAlignedObjectArray<btSoftBody::Link> *this_00;
  byte in_R8B;
  btScalar bVar4;
  Material *unaff_retaddr;
  int in_stack_0000000c;
  btSoftBody *in_stack_00000010;
  Link *l;
  btVector3 *in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffd8;
  
  if (((in_R8B & 1) != 0) &&
     (bVar1 = checkLink(in_RDX,in_RCX,
                        (Node *)(CONCAT17(in_R8B,in_stack_ffffffffffffffd8) & 0x1ffffffffffffff)),
     bVar1)) {
    return;
  }
  appendLink(in_stack_00000010,in_stack_0000000c,unaff_retaddr);
  this_00 = (btAlignedObjectArray<btSoftBody::Link> *)(in_RDI + 0x39);
  iVar2 = btAlignedObjectArray<btSoftBody::Link>::size(this_00);
  pLVar3 = btAlignedObjectArray<btSoftBody::Link>::operator[](this_00,iVar2 + -1);
  pLVar3->m_n[0] = in_RSI;
  pLVar3->m_n[1] = (Node *)in_RDX;
  operator-(in_stack_ffffffffffffffc0,in_RDI);
  bVar4 = btVector3::length((btVector3 *)0x26a2c7);
  pLVar3->m_rl = bVar4;
  *(undefined1 *)(in_RDI[0x4b].m_floats + 1) = 1;
  return;
}

Assistant:

void			btSoftBody::appendLink(	Node* node0,
									   Node* node1,
									   Material* mat,
									   bool bcheckexist)
{
	if((!bcheckexist)||(!checkLink(node0,node1)))
	{
		appendLink(-1,mat);
		Link&	l=m_links[m_links.size()-1];
		l.m_n[0]		=	node0;
		l.m_n[1]		=	node1;
		l.m_rl			=	(l.m_n[0]->m_x-l.m_n[1]->m_x).length();
		m_bUpdateRtCst=true;
	}
}